

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O0

void FFTProcess<float>(UnityComplexNumber *data,int numsamples,bool forward)

{
  float fVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  double dVar4;
  double dVar5;
  float local_70;
  UnityComplexNumberT<float> local_6c;
  UnityComplexNumberT<float> t;
  int i_1;
  int m_1;
  int step;
  UnityComplexNumberT<float> wd;
  UnityComplexNumberT<float> wr;
  int j_2;
  float w0;
  uint j_1;
  uint i;
  uint m;
  uint k;
  uint j;
  uint n;
  uint *tbl;
  uint numbits;
  uint count;
  bool forward_local;
  int numsamples_local;
  UnityComplexNumber *data_local;
  
  tbl._0_4_ = 0;
  for (tbl._4_4_ = 1; tbl._4_4_ < (uint)numsamples; tbl._4_4_ = tbl._4_4_ * 2) {
    tbl._0_4_ = (uint)tbl + 1;
  }
  _j = FFTProcess<float>::reversetable[(uint)tbl];
  if (_j == (uint *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)numsamples;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    _j = (uint *)operator_new__(uVar3);
    for (k = 0; k < (uint)numsamples; k = k + 1) {
      m = 1;
      i = 0;
      for (j_1 = numsamples >> 1; j_1 != 0; j_1 = j_1 >> 1) {
        if ((k & j_1) != 0) {
          i = m | i;
        }
        m = m * 2;
      }
      _j[k] = i;
    }
    FFTProcess<float>::reversetable[(uint)tbl] = _j;
  }
  for (w0 = 0.0; (uint)w0 < (uint)numsamples; w0 = (float)((int)w0 + 1)) {
    fVar1 = (float)_j[(uint)w0];
    if ((uint)w0 < (uint)fVar1) {
      UnitySwap<float>(&data[(uint)w0].re,&data[(uint)fVar1].re);
      UnitySwap<float>(&data[(uint)w0].im,&data[(uint)fVar1].im);
    }
  }
  local_70 = -3.1415927;
  if (!forward) {
    local_70 = 3.1415927;
  }
  wr.im = local_70;
  for (wr.re = 1.4013e-45; (int)wr.re < numsamples; wr.re = (float)((int)wr.re * 2)) {
    dVar4 = std::cos((double)(ulong)(uint)wr.im);
    dVar5 = std::sin((double)(ulong)(uint)wr.im);
    UnityComplexNumberT<float>::Set(&wd,SUB84(dVar4,0),SUB84(dVar5,0));
    UnityComplexNumberT<float>::Set((UnityComplexNumberT<float> *)&m_1,1.0,0.0);
    for (t.im = 0.0; (int)t.im < (int)wr.re; t.im = (float)((int)t.im + 1)) {
      for (t.re = t.im; (int)t.re < numsamples; t.re = (float)((int)wr.re * 2 + (int)t.re)) {
        UnityComplexNumberT<float>::Mul<float,float,float>
                  ((UnityComplexNumberT<float> *)&m_1,data + ((int)t.re + (int)wr.re),&local_6c);
        UnityComplexNumberT<float>::Sub<float,float,float>
                  (data + (int)t.re,&local_6c,data + ((int)t.re + (int)wr.re));
        UnityComplexNumberT<float>::Add<float,float,float>
                  (data + (int)t.re,&local_6c,data + (int)t.re);
      }
      UnityComplexNumberT<float>::Mul<float,float,float>
                ((UnityComplexNumberT<float> *)&m_1,&wd,(UnityComplexNumberT<float> *)&m_1);
    }
    wr.im = wr.im * 0.5;
  }
  return;
}

Assistant:

static void FFTProcess(UnityComplexNumber* data, int numsamples, bool forward)
{
    unsigned int count = 1, numbits = 0;
    while (count < numsamples)
    {
        count += count;
        ++numbits;
    }

    static unsigned int* reversetable[32] = { NULL };
    unsigned int* tbl = reversetable[numbits];
    if (tbl == NULL)
    {
        tbl = new unsigned int[numsamples];
        for (unsigned int n = 0; n < numsamples; n++)
        {
            unsigned int j = 1, k = 0, m = numsamples >> 1;
            while (m > 0)
            {
                if (n & m)
                    k |= j;
                j += j;
                m >>= 1;
            }
            tbl[n] = k;
        }
#if ENABLE_TESTS
        for (unsigned int n = 0; n < numsamples; n++)
        {
            assert(tbl[tbl[n]] == n);
        }
#endif
        reversetable[numbits] = tbl;
    }

    for (unsigned int i = 0; i < numsamples; i++)
    {
        unsigned int j = tbl[i];
        if (i < j)
        {
            UnitySwap(data[i].re, data[j].re);
            UnitySwap(data[i].im, data[j].im);
        }
    }

    T w0 = (forward) ? -T(kPI_double) : T(kPI_double);
    for (int j = 1; j < numsamples; j += j)
    {
        UnityComplexNumberT<T> wr, wd;
        wr.Set(T(cos(w0)), T(sin(w0)));
        wd.Set(T(1.0), T(0.0));
        int step = j + j;
        for (int m = 0; m < j; ++m)
        {
            for (int i = m; i < numsamples; i += step)
            {
                UnityComplexNumberT<T> t;
                UnityComplexNumber::Mul(wd, data[i + j], t);
                UnityComplexNumber::Sub(data[i], t, data[i + j]);
                UnityComplexNumber::Add(data[i], t, data[i]);
            }
            UnityComplexNumber::Mul(wd, wr, wd);
        }
        w0 *= T(0.5);
    }
}